

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

FieldDescriptorProto *
google::protobuf::descriptor_unittest::AddField
          (DescriptorProto *parent,string *name,int number,Label label,Type type)

{
  FieldDescriptorProto *this;
  uint32_t *puVar1;
  Arena *arena;
  FieldDescriptorProto *result;
  Type type_local;
  Label label_local;
  int number_local;
  string *name_local;
  DescriptorProto *parent_local;
  
  this = DescriptorProto::add_field(parent);
  puVar1 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)this);
  internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,name,arena);
  FieldDescriptorProto::set_number(this,number);
  FieldDescriptorProto::set_label(this,label);
  FieldDescriptorProto::set_type(this,type);
  return this;
}

Assistant:

FieldDescriptorProto* AddField(DescriptorProto* parent, const std::string& name,
                               int number, FieldDescriptorProto::Label label,
                               FieldDescriptorProto::Type type) {
  FieldDescriptorProto* result = parent->add_field();
  result->set_name(name);
  result->set_number(number);
  result->set_label(label);
  result->set_type(type);
  return result;
}